

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall
TasGrid::GridSequence::loadConstructedPoint
          (GridSequence *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  double *pdVar1;
  pointer pdVar2;
  SimpleConstructData *pSVar3;
  int iVar4;
  _Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> _Var5;
  long lVar6;
  int *d;
  pointer piVar7;
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> approx_value;
  vector<int,_std::allocator<int>_> scratch;
  vector<double,_std::allocator<double>_> surplus;
  allocator_type local_b1;
  vector<int,_std::allocator<int>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  getMultiIndex(&local_b0,this,x);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)(this->super_BaseCanonicalGrid).num_dimensions,
             (allocator_type *)&local_98);
  if ((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    memmove(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start,local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar7 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if (0 < *piVar7) {
        *piVar7 = *piVar7 + -1;
        iVar4 = MultiIndexSet::getSlot
                          (&(this->super_BaseCanonicalGrid).points,
                           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
        if (iVar4 == -1) {
          pSVar3 = (this->dynamic_values)._M_t.
                   super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
                   .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
          ::std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_98,
                     (vector<int,_std::allocator<int>_> *)&local_b0);
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_80,(vector<double,_std::allocator<double>_> *)y);
          _Var5._M_impl._M_head._M_next = (_Fwd_list_impl)operator_new(0x38);
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 8))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 0x10))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 0x18))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 0x20))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 0x28))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (((_Fwd_list_impl *)((long)_Var5._M_impl._M_head._M_next + 0x30))->_M_head)._M_next =
               (_Fwd_list_node_base *)
               local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          *(_Fwd_list_node_base **)_Var5._M_impl._M_head._M_next =
               (_Fwd_list_node_base *)
               (pSVar3->data).
               super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>._M_impl.
               _M_head;
          (pSVar3->data).super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>
          ._M_impl = _Var5._M_impl._M_head._M_next;
          MultiIndexSet::removeIndex
                    (&((this->dynamic_values)._M_t.
                       super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
                       .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
                      initial_points,(vector<int,_std::allocator<int>_> *)&local_b0);
          goto LAB_001a9618;
        }
        *piVar7 = *piVar7 + 1;
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_98,(long)(this->super_BaseCanonicalGrid).num_outputs,(allocator_type *)&local_48
            );
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)(this->super_BaseCanonicalGrid).num_outputs,&local_b1);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])
              (this,x,local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pdVar2 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar1 = (double *)
                 ((long)(_Fwd_list_node_base **)
                        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6);
        *(double *)
         ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar6) =
             *(double *)((long)pdVar2 + lVar6) - *pdVar1;
        lVar6 = lVar6 + 8;
      } while ((_Fwd_list_node_base *)(pdVar1 + 1) !=
               (_Fwd_list_node_base *)
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  expandGrid(this,&local_b0,y,(vector<double,_std::allocator<double>_> *)&local_48);
  MultiIndexSet::removeIndex
            (&((this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
              initial_points,(vector<int,_std::allocator<int>_> *)&local_b0);
  loadConstructedPoints(this);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_Fwd_list_node_base *)
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Fwd_list_node_base *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001a9618:
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::loadConstructedPoint(const double x[], const std::vector<double> &y){
    std::vector<int> p = getMultiIndex(x);
    std::vector<int> scratch(num_dimensions);

    if (MultiIndexManipulations::isLowerComplete(p, points, scratch)){
        std::vector<double> approx_value(num_outputs), surplus(num_outputs);;
        if (!points.empty()){
            evaluate(x, approx_value.data());
            std::transform(approx_value.begin(), approx_value.end(), y.begin(), surplus.begin(), [&](double e, double v)->double{ return v - e; });
        }
        expandGrid(p, y, surplus);
        dynamic_values->initial_points.removeIndex(p);

        loadConstructedPoints(); // batch operation, if the new point has unleashed a bunch of previously available ones
    }else{
        dynamic_values->data.push_front({p, y});
        dynamic_values->initial_points.removeIndex(p);
    }
}